

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void make_happy_shk(monst *shkp,boolean silentkops)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  boolean bVar4;
  xchar tolev;
  int iVar5;
  char *pcVar6;
  obj *poVar7;
  char local_128 [7];
  boolean vanished;
  char shk_nam [256];
  eshk *eshkp;
  boolean wasmad;
  boolean silentkops_local;
  monst *shkp_local;
  
  uVar1 = *(uint *)&shkp->field_0x60;
  pacify_shk(shkp);
  *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
  shkp[0x1b].mtame = '\0';
  shkp[0x1b].m_ap_type = '\0';
  shkp[0x1b].mfrozen = '\0';
  shkp[0x1b].mblinded = '\0';
  if (urole.malenum != 0x164) {
    iVar5 = sgn((int)u.ualign.type);
    adjalign(iVar5);
  }
  iVar5 = inhishop(shkp);
  if (iVar5 != 0) {
    if ((uVar1 >> 0x16 & 1) == 0) {
      pcVar6 = Monnam(shkp);
      pline("%s calms down.",pcVar6);
    }
    goto LAB_002c8fed;
  }
  if (shkp->wormno == '\0') {
    if ((viz_array[shkp->my][shkp->mx] & 2U) != 0) goto LAB_002c8a7f;
    if (((((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((bVar3 = false, ublindf != (obj *)0x0 && (bVar3 = false, ublindf->oartifact == '\x1d'))))
        && ((u.uprops[0x40].intrinsic != 0 ||
            ((u.uprops[0x40].extrinsic != 0 ||
             (bVar3 = false, ((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
       (bVar3 = false, (shkp->data->mflags3 & 0x200) != 0)) {
      bVar2 = viz_array[shkp->my][shkp->mx] & 1;
      goto joined_r0x002c8a79;
    }
  }
  else {
    bVar2 = worm_known(level,shkp);
joined_r0x002c8a79:
    bVar3 = false;
    if (bVar2 != 0) {
LAB_002c8a7f:
      if ((((((*(uint *)&shkp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) ||
          (bVar3 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         (bVar3 = false, (*(uint *)&shkp->field_0x60 >> 7 & 1) == 0)) {
        bVar3 = (*(uint *)&shkp->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
      }
    }
  }
  pcVar6 = mon_nam(shkp);
  strcpy(local_128,pcVar6);
  bVar4 = on_level((d_level *)&shkp[0x1b].mxlth,&shkp->dlevel->z);
  if (bVar4 == '\0') {
    if (((((shkp->data->mflags1 & 0x10000) == 0) &&
         ((poVar7 = which_armor(shkp,4), poVar7 == (obj *)0x0 ||
          (poVar7 = which_armor(shkp,4), poVar7->otyp != 0x4f)))) &&
        (((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
          ((((u.uprops[0x19].intrinsic != 0 ||
             (((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)) ||
              (youmonst.data == mons + 0x31)))) || (youmonst.data == mons + 0x32)) &&
           (u.uprops[0x19].blocked == 0)))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar5 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar4 = match_warn_of_mon(shkp), bVar4 != '\0')))) {
      bVar3 = true;
    }
    mdrop_special_objs(shkp);
    tolev = ledger_no((d_level *)&shkp[0x1b].mxlth);
    migrate_to_level(shkp,tolev,'\x01',(coord *)&shkp[0x1b].mintrinsics);
  }
  else {
    home_shk(shkp,'\0');
    if (shkp->wormno == '\0') {
      if ((viz_array[shkp->my][shkp->mx] & 2U) == 0) {
        if (((((u.uprops[0x1e].intrinsic != 0) ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
            ((u.uprops[0x40].intrinsic == 0 &&
             ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
           ((shkp->data->mflags3 & 0x200) == 0)) goto LAB_002c8fab;
        bVar2 = viz_array[shkp->my][shkp->mx] & 1;
        goto joined_r0x002c8d03;
      }
    }
    else {
      bVar2 = worm_known(level,shkp);
joined_r0x002c8d03:
      if (bVar2 == 0) goto LAB_002c8fab;
    }
    if ((((((*(uint *)&shkp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
         (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
       ((((*(uint *)&shkp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&shkp->field_0x60 >> 9 & 1) == 0)
         ) && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
      bVar3 = false;
    }
  }
LAB_002c8fab:
  if (bVar3) {
    pline("Satisfied, %s suddenly disappears!",local_128);
  }
LAB_002c8fed:
  bVar4 = angry_shk_exists();
  if (bVar4 == '\0') {
    kops_gone(silentkops);
    pacify_guards();
  }
  return;
}

Assistant:

void make_happy_shk(struct monst *shkp, boolean silentkops)
{
	boolean wasmad = ANGRY(shkp);
	struct eshk *eshkp = ESHK(shkp);

	pacify_shk(shkp);
	eshkp->following = 0;
	eshkp->robbed = 0L;
	if (!Role_if (PM_ROGUE))
		adjalign(sgn(u.ualign.type));
	if (!inhishop(shkp)) {
		char shk_nam[BUFSZ];
		boolean vanished = canseemon(level, shkp);

		strcpy(shk_nam, mon_nam(shkp));
		if (on_level(&eshkp->shoplevel, &shkp->dlevel->z)) {
			home_shk(shkp, FALSE);
			/* didn't disappear if shk can still be seen */
			if (canseemon(level, shkp)) vanished = FALSE;
		} else {
			/* if sensed, does disappear regardless whether seen */
			if (sensemon(shkp)) vanished = TRUE;
			/* can't act as porter for the Amulet, even if shk
			   happens to be going farther down rather than up */
			mdrop_special_objs(shkp);
			/* arrive near shop's door */
			migrate_to_level(shkp, ledger_no(&eshkp->shoplevel),
					 MIGR_APPROX_XY, &eshkp->shd);
		}
		if (vanished)
		    pline("Satisfied, %s suddenly disappears!", shk_nam);
	} else if (wasmad)
		pline("%s calms down.", Monnam(shkp));

	if (!angry_shk_exists()) {
		kops_gone(silentkops);
		pacify_guards();
	}
}